

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Gia_Man_t *
Dam_ManAreaBalanceInt
          (Gia_Man_t *pGia,Vec_Int_t *vCiLevels,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint a;
  int iVar4;
  Dam_Man_t *p_00;
  Vec_Int_t *pVVar5;
  Gia_Man_t *pGVar6;
  abctime aVar7;
  float fVar8;
  int nDivsUsed;
  int nDivsAll;
  int iDiv;
  int i;
  Dam_Man_t *p;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nNewNodesMax_local;
  Vec_Int_t *vCiLevels_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Dam_ManAlloc(pGia);
  iVar3 = Gia_ManSetLevels(p_00->pGia,vCiLevels);
  p_00->nLevelMax = iVar3;
  pVVar5 = Gia_ManReverseLevel(p_00->pGia);
  p_00->vNodLevR = pVVar5;
  pVVar5 = p_00->pGia->vLevels;
  iVar3 = Gia_ManObjNum(p_00->pGia);
  Vec_IntFillExtra(pVVar5,(iVar3 * 3) / 2,0);
  Dam_ManCreatePairs(p_00,fVerbose);
  nDivsAll = 0;
  while( true ) {
    bVar2 = false;
    if (nDivsAll < nNewNodesMax) {
      fVar8 = Vec_QueTopPriority(p_00->vQue);
      bVar2 = 2.0 <= fVar8;
    }
    if (!bVar2) break;
    iVar3 = Vec_QuePop(p_00->vQue);
    if (fVeryVerbose != 0) {
      Dam_PrintDiv(p_00,iVar3);
    }
    Dam_ManUpdate(p_00,iVar3);
    nDivsAll = nDivsAll + 1;
  }
  if (fVeryVerbose != 0) {
    Dam_PrintDiv(p_00,0);
  }
  pGVar6 = Dam_ManMultiAig(p_00);
  if (fVerbose != 0) {
    a = Hash_IntManEntryNum(p_00->vHash);
    uVar1 = p_00->nDivs;
    printf("Div:  ");
    iVar3 = Abc_MaxInt(a,1);
    printf("  Total =%9d (%6.2f %%) ",((double)(int)a * 100.0) / (double)iVar3,(ulong)a);
    iVar3 = Abc_MaxInt(a,1);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar1 * 100.0) / (double)iVar3,(ulong)uVar1);
    uVar1 = p_00->nGain;
    iVar3 = p_00->nGain;
    iVar4 = Abc_MaxInt(p_00->nAnds,1);
    printf("  Gain =%6d (%6.2f %%)",((double)iVar3 * 100.0) / (double)iVar4,(ulong)uVar1);
    printf("  GainX = %d  ",(ulong)(uint)p_00->nGainX);
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar7 - p_00->clkStart);
  }
  Dam_ManFree(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Dam_ManAreaBalanceInt( Gia_Man_t * pGia, Vec_Int_t * vCiLevels, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Dam_Man_t * p;
    int i, iDiv;
    p = Dam_ManAlloc( pGia );
    p->nLevelMax = Gia_ManSetLevels( p->pGia, vCiLevels );
    p->vNodLevR = Gia_ManReverseLevel( p->pGia );
    Vec_IntFillExtra( p->pGia->vLevels, 3*Gia_ManObjNum(p->pGia)/2, 0 );
    Dam_ManCreatePairs( p, fVerbose );
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vQue) >= 2; i++ )
    {
        iDiv = Vec_QuePop(p->vQue);
        if ( fVeryVerbose )
            Dam_PrintDiv( p, iDiv );
        Dam_ManUpdate( p, iDiv );
    }
    if ( fVeryVerbose )
        Dam_PrintDiv( p, 0 );
    pNew = Dam_ManMultiAig( p );
    if ( fVerbose )
    {
        int nDivsAll = Hash_IntManEntryNum(p->vHash);
        int nDivsUsed = p->nDivs;
        printf( "Div:  " );
        printf( "  Total =%9d (%6.2f %%) ",   nDivsAll,   100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Used =%9d (%6.2f %%)",     nDivsUsed,  100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Gain =%6d (%6.2f %%)",     p->nGain,   100.0 * p->nGain / Abc_MaxInt(p->nAnds, 1) );
        printf( "  GainX = %d  ",             p->nGainX  );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    Dam_ManFree( p );
    return pNew;
}